

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setType(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,Type tp)

{
  SPxOut *pSVar1;
  char cVar2;
  int32_t iVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  long lVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  char *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  byte bVar9;
  Verbosity old_verbosity;
  undefined1 local_24 [4];
  
  bVar9 = 0;
  if (this->theType != tp) {
    this->theType = tp;
    pcVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
    pcVar6 = pcVar4;
    pnVar8 = &this->m_nonbasicValue;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar8->m_backend).data._M_elems[0] = (pcVar6->data)._M_elems[0];
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar9 * -8 + 4);
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + (ulong)bVar9 * -8 + 4);
    }
    (this->m_nonbasicValue).m_backend.exp = pcVar4->exp;
    (this->m_nonbasicValue).m_backend.neg = pcVar4->neg;
    iVar3 = pcVar4->prec_elem;
    (this->m_nonbasicValue).m_backend.fpclass = pcVar4->fpclass;
    (this->m_nonbasicValue).m_backend.prec_elem = iVar3;
    this->m_nonbasicValueUpToDate = false;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x77])(this);
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"Switching to ",0xd);
      pcVar7 = "entering";
      if (tp == LEAVE) {
        pcVar7 = "leaving";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],pcVar7,(ulong)(tp != LEAVE) + 7);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," algorithm",10);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_24);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setType(Type tp)
{

   if(theType != tp)
   {
      theType = tp;

      forceRecompNonbasicValue();

      unInit();
#if 0
      else
      {
         if(!matrixIsSetup)
         {
            SPxBasisBase<R>::load(this);
            // SPxBasisBase<R>::load(desc());
            // not needed, because load(this) allready loads descriptor
         }

         factorized = false;
         m_numCycle = 0;
#endif
         SPX_MSG_INFO3((*spxout), (*spxout) << "Switching to "
                       << static_cast<const char*>((tp == LEAVE)
                             ? "leaving" : "entering")
                       << " algorithm" << std::endl;)
      }
   }